

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

fdb_compact_decision
cb_upt(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
      uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  size_t sVar1;
  size_t *in_RCX;
  short *in_RDX;
  int in_ESI;
  long in_stack_00000008;
  size_t vlen_out;
  void *v_out;
  fdb_doc tdoc;
  fdb_status s;
  char valuestr [13];
  char keystr [8];
  char bodybuf [256];
  char keybuf [256];
  int n;
  int j;
  int i;
  cb_upt_args *args;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  int iVar2;
  void **in_stack_fffffffffffffc90;
  fdb_encryption_key *in_stack_fffffffffffffc98;
  void *in_stack_fffffffffffffca0;
  fdb_kvs_handle *in_stack_fffffffffffffca8;
  fdb_doc local_308;
  fdb_status local_2b4;
  char local_2ad [13];
  char local_2a0 [8];
  fdb_kvs_handle local_298;
  int local_90;
  uint local_8c;
  long local_88;
  __time_t local_60;
  __suseconds_t local_58;
  timeval local_40 [2];
  size_t *local_20;
  short *local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  gettimeofday(local_40,(__timezone_ptr_t)0x0);
  local_60 = local_40[0].tv_sec;
  local_58 = local_40[0].tv_usec;
  local_88 = in_stack_00000008;
  if (local_c == 2) {
    local_298.bub_ctx.handle._4_4_ = 10;
    builtin_strncpy(local_2a0,"new%04d",8);
    builtin_strncpy(local_2ad,"new_body%04d",0xd);
    *(int *)(in_stack_00000008 + 0x24) = *(int *)(in_stack_00000008 + 0x24) + 1;
    if ((5 < *(int *)(in_stack_00000008 + 0x24)) && (*(int *)(in_stack_00000008 + 0x20) == 0)) {
      memset(&local_308,0,0x50);
      local_308.key = (void *)local_20[4];
      local_308.keylen = *local_20;
      local_2b4 = fdb_get(*(fdb_kvs_handle **)(local_88 + 8),&local_308);
      if (local_2b4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x8d2);
        cb_upt::__test_pass = 0;
        if (local_2b4 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x8d2,
                        "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      free(local_308.meta);
      free(local_308.body);
      for (local_8c = 0; (int)local_8c < local_298.bub_ctx.handle._4_4_ / 2; local_8c = local_8c + 1
          ) {
        sprintf((char *)&local_298.config.encryption_key,local_2a0,(ulong)local_8c);
        sprintf((char *)&local_298,local_2ad,(ulong)local_8c);
        strlen((char *)&local_298.config.encryption_key);
        strlen((char *)&local_298);
        local_2b4 = fdb_set_kv(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                               (size_t)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        if (local_2b4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x8db);
          cb_upt::__test_pass = 0;
          if (local_2b4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x8db,
                          "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
        local_2b4 = fdb_commit(in_stack_fffffffffffffc68,'\0');
        if (local_2b4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x8dd);
          cb_upt::__test_pass = 0;
          if (local_2b4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x8dd,
                          "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
        for (local_90 = 0; local_90 <= (int)local_8c; local_90 = local_90 + 1) {
          sprintf((char *)&local_298.config.encryption_key,local_2a0,(ulong)local_8c);
          sprintf((char *)&local_298,local_2ad,(ulong)local_8c);
          strlen((char *)&local_298.config.encryption_key);
          local_2b4 = fdb_get_kv(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                                 (size_t)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          if (local_2b4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x8e6);
            cb_upt::__test_pass = 0;
            if (local_2b4 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x8e6,
                            "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                           );
            }
          }
          fdb_free_block((void *)0x1112e5);
        }
      }
      *(undefined4 *)(local_88 + 0x20) = 1;
    }
    if ((local_298.bub_ctx.handle._4_4_ < *(int *)(local_88 + 0x24)) &&
       (*(int *)(local_88 + 0x20) == 1)) {
      for (local_8c = 0; (int)local_8c < 2; local_8c = local_8c + 1) {
        sprintf((char *)&local_298.config.encryption_key,"xxx%d",(ulong)local_8c);
        sprintf((char *)&local_298,"xxxvalue%d",(ulong)local_8c);
        in_stack_fffffffffffffc90 = *(void ***)(local_88 + 8);
        in_stack_fffffffffffffc98 = &local_298.config.encryption_key;
        sVar1 = strlen((char *)&local_298.config.encryption_key);
        in_stack_fffffffffffffca0 = (void *)(sVar1 + 1);
        in_stack_fffffffffffffca8 = &local_298;
        strlen((char *)&local_298);
        local_2b4 = fdb_set_kv(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                               (size_t)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        if (local_2b4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x8f3);
          cb_upt::__test_pass = 0;
          if (local_2b4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x8f3,
                          "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
        local_2b4 = fdb_commit(in_stack_fffffffffffffc68,'\0');
        if (local_2b4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x8f5);
          cb_upt::__test_pass = 0;
          if (local_2b4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x8f5,
                          "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
      }
      *(undefined4 *)(local_88 + 0x20) = 2;
    }
    iVar2 = *(int *)(local_88 + 0x24);
    if ((iVar2 == (local_298.bub_ctx.handle._4_4_ * 3) / 2 + 2) && (*(int *)(local_88 + 0x20) == 2))
    {
      for (local_8c = 0; (int)local_8c < 2; local_8c = local_8c + 1) {
        sprintf((char *)&local_298.config.encryption_key,"zzz%d",(ulong)local_8c);
        sprintf((char *)&local_298,"zzzvalue%d",(ulong)local_8c);
        strlen((char *)&local_298.config.encryption_key);
        strlen((char *)&local_298);
        local_2b4 = fdb_set_kv(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                               (size_t)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                               CONCAT44(iVar2,in_stack_fffffffffffffc88));
        if (local_2b4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x901);
          cb_upt::__test_pass = 0;
          if (local_2b4 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x901,
                          "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
      }
      *(undefined4 *)(local_88 + 0x20) = 3;
    }
    if (*local_18 != 0x6264) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","db",local_18,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x905);
      cb_upt::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x905,
                    "fdb_compact_decision cb_upt(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
  }
  return 0;
}

Assistant:

static fdb_compact_decision cb_upt(fdb_file_handle *fhandle,
                                   fdb_compaction_status status,
                                   const char *kv_name,
                                   fdb_doc *doc, uint64_t old_offset,
                                   uint64_t new_offset,
                                   void *ctx)
{
    TEST_INIT();
    struct cb_upt_args *args = (struct cb_upt_args *)ctx;
    (void) fhandle;
    (void) doc;
    (void) old_offset;
    (void) new_offset;

    if (status == FDB_CS_MOVE_DOC) {
        int i, j;
        int n = 10;
        char keybuf[256], bodybuf[256];
        char keystr[] = "new%04d";
        char valuestr[] = "new_body%04d";
        fdb_status s;
        args->nmoves++;
        if (args->nmoves > n/2 && !args->done) {
            // verify if the key is stripped off its prefix
            fdb_doc tdoc;
            memset(&tdoc, 0, sizeof(fdb_doc));
            tdoc.key = doc->key;
            tdoc.keylen = doc->keylen;
            s = fdb_get(args->handle, &tdoc);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            free(tdoc.meta);
            free(tdoc.body);
            // insert new docs
            for (i=0;i<n/2;++i){
                sprintf(keybuf, keystr, i);
                sprintf(bodybuf, valuestr, i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_commit(args->file, FDB_COMMIT_NORMAL);
                TEST_CHK(s == FDB_RESULT_SUCCESS);

                for (j=0; j<=i; ++j){
                    void *v_out;
                    size_t vlen_out;
                    sprintf(keybuf, keystr, i);
                    sprintf(bodybuf, valuestr, i);
                    s = fdb_get_kv(args->handle2, keybuf, strlen(keybuf)+1,
                        &v_out, &vlen_out);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    fdb_free_block(v_out);
                }
            }
            args->done = 1;
        }
        if (args->nmoves > n && args->done == 1) {
            // the first phase is done. insert new docs.
            for (i=0;i<2;++i){
                sprintf(keybuf, "xxx%d", i);
                sprintf(bodybuf, "xxxvalue%d", i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_commit(args->file, FDB_COMMIT_NORMAL);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            args->done = 2;
        }
        if (args->nmoves == (n*3/2 + 2) && args->done == 2) {
            // during the second-second phase,
            // insert new docs, and do not commit.
            for (i=0;i<2;++i){
                sprintf(keybuf, "zzz%d", i);
                sprintf(bodybuf, "zzzvalue%d", i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            args->done = 3;
        }
        TEST_CMP(kv_name, "db", 2);
    }

    return 0;
}